

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowOuterBorders(ImGuiWindow *window)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  ImVec2 this;
  ImVec2 IVar3;
  float y;
  ImRect border_r;
  ImGuiResizeBorderDef *def;
  int border_held;
  float border_size;
  float rounding;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  ImVec2 *in_stack_fffffffffffffef8;
  ImGuiWindow *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  ImGuiWindow *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  ImU32 in_stack_ffffffffffffff44;
  ImVec2 *in_stack_ffffffffffffff48;
  ImDrawList *in_stack_ffffffffffffff50;
  ImVec2 local_a4;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ImDrawList *in_stack_ffffffffffffff80;
  ImVec2 *in_stack_ffffffffffffff88;
  ImDrawList *in_stack_ffffffffffffff90;
  undefined1 local_60 [16];
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  ImVec2 local_30;
  float local_24;
  ImVec2 local_20;
  float local_18;
  float local_14;
  ImGuiContext *local_10;
  long local_8;
  
  local_10 = GImGui;
  local_14 = *(float *)(in_RDI + 0x48);
  local_18 = *(float *)(in_RDI + 0x4c);
  local_8 = in_RDI;
  if ((0.0 < local_18) && ((*(uint *)(in_RDI + 0xc) & 0x80) == 0)) {
    in_stack_ffffffffffffff48 = *(ImVec2 **)(in_RDI + 0x270);
    in_stack_ffffffffffffff50 = (ImDrawList *)(in_RDI + 0x10);
    local_20 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x13a23d);
    GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                SUB84(in_stack_ffffffffffffff00,0));
    ImDrawList::AddRect(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        (ImVec2 *)in_stack_ffffffffffffff80,(ImU32)in_stack_ffffffffffffff7c,
                        in_stack_ffffffffffffff78,
                        (ImDrawFlags)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                        (float)in_stack_ffffffffffffff70);
  }
  local_24 = (float)(int)*(char *)(local_8 + 0x99);
  if (local_24 != -NAN) {
    local_30 = (ImVec2)(resize_border_def + (int)local_24);
    local_40 = GetResizeBorderRect(in_stack_ffffffffffffff10,
                                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                                   (float)in_stack_ffffffffffffff08,
                                   (float)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    local_60._8_8_ =
         ImLerp(in_stack_fffffffffffffef8,
                (ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff00 = (ImGuiWindow *)local_60;
    ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff00,0.5,0.5);
    local_50 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x13a37e);
    operator*(in_stack_fffffffffffffee8,0.0);
    local_48 = operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x13a3bb);
    ImDrawList::PathArcTo
              (in_stack_ffffffffffffff80,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),(float)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68);
    this = ImLerp(in_stack_fffffffffffffef8,
                  (ImVec2 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                  in_stack_fffffffffffffee8);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,0.5,0.5);
    operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x13a462);
    IVar3 = operator*(in_stack_fffffffffffffee8,0.0);
    operator+(in_stack_fffffffffffffee8,(ImVec2 *)0x13a49f);
    ImDrawList::PathArcTo
              ((ImDrawList *)this,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),IVar3.y,
               IVar3.x,in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff38 = *(undefined8 *)(local_8 + 0x270);
    in_stack_ffffffffffffff44 =
         GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     SUB84(in_stack_ffffffffffffff00,0));
    ImMax<float>(2.0,local_18);
    ImDrawList::PathStroke
              ((ImDrawList *)in_stack_ffffffffffffff00,
               (ImU32)((ulong)in_stack_fffffffffffffef8 >> 0x20),
               (ImDrawFlags)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  }
  if ((0.0 < (local_10->Style).FrameBorderSize) && ((*(uint *)(local_8 + 0xc) & 1) == 0)) {
    fVar2 = *(float *)(local_8 + 0x14);
    fVar1 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff00);
    fVar2 = (fVar2 + fVar1) - 1.0;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,*(float *)(local_8 + 0x10) + local_18,fVar2);
    ImVec2::ImVec2(&local_a4,(*(float *)(local_8 + 0x10) + *(float *)(local_8 + 0x18)) - local_18,
                   fVar2);
    GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                SUB84(in_stack_ffffffffffffff00,0));
    ImDrawList::AddLine(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (ImU32)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                        (float)in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

static void ImGui::RenderWindowOuterBorders(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    float rounding = window->WindowRounding;
    float border_size = window->WindowBorderSize;
    if (border_size > 0.0f && !(window->Flags & ImGuiWindowFlags_NoBackground))
        window->DrawList->AddRect(window->Pos, window->Pos + window->Size, GetColorU32(ImGuiCol_Border), rounding, 0, border_size);

    int border_held = window->ResizeBorderHeld;
    if (border_held != -1)
    {
        const ImGuiResizeBorderDef& def = resize_border_def[border_held];
        ImRect border_r = GetResizeBorderRect(window, border_held, rounding, 0.0f);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN1) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle - IM_PI * 0.25f, def.OuterAngle);
        window->DrawList->PathArcTo(ImLerp(border_r.Min, border_r.Max, def.SegmentN2) + ImVec2(0.5f, 0.5f) + def.InnerDir * rounding, rounding, def.OuterAngle, def.OuterAngle + IM_PI * 0.25f);
        window->DrawList->PathStroke(GetColorU32(ImGuiCol_SeparatorActive), 0, ImMax(2.0f, border_size)); // Thicker than usual
    }
    if (g.Style.FrameBorderSize > 0 && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
    {
        float y = window->Pos.y + window->TitleBarHeight() - 1;
        window->DrawList->AddLine(ImVec2(window->Pos.x + border_size, y), ImVec2(window->Pos.x + window->Size.x - border_size, y), GetColorU32(ImGuiCol_Border), g.Style.FrameBorderSize);
    }
}